

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::ArrayFeatureType::ArrayFeatureType(ArrayFeatureType *this)

{
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ArrayFeatureType_006fd5e0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->shape_).current_size_ = 0;
  (this->shape_).total_size_ = 0;
  (this->shape_).rep_ = (Rep *)0x0;
  if (this != (ArrayFeatureType *)&_ArrayFeatureType_default_instance_) {
    protobuf_FeatureTypes_2eproto::InitDefaults();
  }
  this->datatype_ = 0;
  this->_oneof_case_[1] = 0;
  this->_cached_size_ = 0;
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

ArrayFeatureType::ArrayFeatureType()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_FeatureTypes_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.ArrayFeatureType)
}